

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-feed.c
# Opt level: O1

void CGTFS_Feed(void)

{
  FILE *pFVar1;
  int iVar2;
  uint uVar3;
  feed_t f;
  feed_t f2;
  feed_t fStack_2f8;
  feed_t local_208;
  feed_t local_118;
  
  iVar2 = greatest_test_pre("feed_parsing");
  if (iVar2 != 0) {
    iVar2 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar2 == 0) {
      read_feed(&fStack_2f8,"../tests/data/stupid_gtfs");
      if (fStack_2f8.agency_count == 4) {
        if (fStack_2f8.calendar_dates_count == 9) {
          if (fStack_2f8.calendar_records_count == 4) {
            if (fStack_2f8.fare_attributes_count == 2) {
              if (fStack_2f8.fare_rules_count == 4) {
                if (fStack_2f8.feed_info_count == 1) {
                  if (fStack_2f8.frequencies_count == 0xb) {
                    if (fStack_2f8.levels_count == 4) {
                      if (fStack_2f8.pathways_count == 2) {
                        if (fStack_2f8.routes_count == 8) {
                          if (fStack_2f8.shapes_count == 10) {
                            if (fStack_2f8.stop_times_count == 0x1c) {
                              if (fStack_2f8.stops_count == 6) {
                                if (fStack_2f8.transfers_count == 4) {
                                  greatest_info.assertions = greatest_info.assertions + 0xf;
                                  if (fStack_2f8.trips_count == 4) {
                                    free_feed(&fStack_2f8);
                                    greatest_info.msg = (char *)0x0;
                                    iVar2 = 0;
                                    goto LAB_0011bd12;
                                  }
                                  greatest_info.fail_line = 0x1a;
                                  greatest_info.msg = "4 != f.trips_count";
                                }
                                else {
                                  greatest_info.fail_line = 0x19;
                                  greatest_info.msg = "4 != f.transfers_count";
                                  greatest_info.assertions = greatest_info.assertions + 0xe;
                                }
                              }
                              else {
                                greatest_info.fail_line = 0x18;
                                greatest_info.msg = "6 != f.stops_count";
                                greatest_info.assertions = greatest_info.assertions + 0xd;
                              }
                            }
                            else {
                              greatest_info.fail_line = 0x17;
                              greatest_info.msg = "28 != f.stop_times_count";
                              greatest_info.assertions = greatest_info.assertions + 0xc;
                            }
                          }
                          else {
                            greatest_info.fail_line = 0x16;
                            greatest_info.msg = "10 != f.shapes_count";
                            greatest_info.assertions = greatest_info.assertions + 0xb;
                          }
                        }
                        else {
                          greatest_info.fail_line = 0x15;
                          greatest_info.msg = "8 != f.routes_count";
                          greatest_info.assertions = greatest_info.assertions + 10;
                        }
                      }
                      else {
                        greatest_info.fail_line = 0x14;
                        greatest_info.msg = "2 != f.pathways_count";
                        greatest_info.assertions = greatest_info.assertions + 9;
                      }
                    }
                    else {
                      greatest_info.fail_line = 0x13;
                      greatest_info.msg = "4 != f.levels_count";
                      greatest_info.assertions = greatest_info.assertions + 8;
                    }
                  }
                  else {
                    greatest_info.fail_line = 0x12;
                    greatest_info.msg = "11 != f.frequencies_count";
                    greatest_info.assertions = greatest_info.assertions + 7;
                  }
                }
                else {
                  greatest_info.fail_line = 0x11;
                  greatest_info.msg = "1 != f.feed_info_count";
                  greatest_info.assertions = greatest_info.assertions + 6;
                }
              }
              else {
                greatest_info.fail_line = 0x10;
                greatest_info.msg = "4 != f.fare_rules_count";
                greatest_info.assertions = greatest_info.assertions + 5;
              }
            }
            else {
              greatest_info.fail_line = 0xf;
              greatest_info.msg = "2 != f.fare_attributes_count";
              greatest_info.assertions = greatest_info.assertions + 4;
            }
          }
          else {
            greatest_info.fail_line = 0xe;
            greatest_info.msg = "4 != f.calendar_records_count";
            greatest_info.assertions = greatest_info.assertions + 3;
          }
        }
        else {
          greatest_info.fail_line = 0xd;
          greatest_info.msg = "9 != f.calendar_dates_count";
          greatest_info.assertions = greatest_info.assertions + 2;
        }
      }
      else {
        greatest_info.fail_line = 0xc;
        greatest_info.msg = "4 != f.agency_count";
        greatest_info.assertions = greatest_info.assertions + 1;
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-feed.c"
      ;
      iVar2 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_0011c045;
    }
LAB_0011bd12:
    greatest_test_post(iVar2);
  }
  iVar2 = greatest_test_pre("feed_comparison");
  if (iVar2 == 0) {
    return;
  }
  iVar2 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
  if (iVar2 == 0) {
    read_feed(&fStack_2f8,"../tests/data/stupid_gtfs");
    read_feed(&local_118,"../tests/data/stupid_gtfs");
    read_feed(&local_208,"../tests/data/pocono_pony");
    greatest_info.assertions = greatest_info.assertions + 1;
    iVar2 = equal_feeds(&fStack_2f8,&local_118);
    if (iVar2 == 1) {
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar2 = equal_feeds(&fStack_2f8,&local_208);
      if (iVar2 == 0) {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar2 = equal_feeds(&local_118,&local_208);
        if (iVar2 == 0) {
          free_feed(&fStack_2f8);
          free_feed(&local_118);
          free_feed(&local_208);
          greatest_info.msg = (char *)0x0;
          iVar2 = 0;
          goto LAB_0011bf27;
        }
        fwrite("\nExpected: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",0);
        fwrite("\n     Got: ",0xb,1,_stdout);
        pFVar1 = _stdout;
        uVar3 = equal_feeds(&local_118,&local_208);
        fprintf(pFVar1,"%i",(ulong)uVar3);
        fputc(10,_stdout);
        greatest_info.fail_line = 0x29;
        greatest_info.msg = "0 != equal_feeds(&f2, &f3)";
      }
      else {
        fwrite("\nExpected: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",0);
        fwrite("\n     Got: ",0xb,1,_stdout);
        pFVar1 = _stdout;
        uVar3 = equal_feeds(&fStack_2f8,&local_208);
        fprintf(pFVar1,"%i",(ulong)uVar3);
        fputc(10,_stdout);
        greatest_info.fail_line = 0x28;
        greatest_info.msg = "0 != equal_feeds(&f1, &f3)";
      }
    }
    else {
      fwrite("\nExpected: ",0xb,1,_stdout);
      fprintf(_stdout,"%i",1);
      fwrite("\n     Got: ",0xb,1,_stdout);
      pFVar1 = _stdout;
      uVar3 = equal_feeds(&fStack_2f8,&local_118);
      fprintf(pFVar1,"%i",(ulong)uVar3);
      fputc(10,_stdout);
      greatest_info.fail_line = 0x27;
      greatest_info.msg = "1 != equal_feeds(&f1, &f2)";
    }
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-feed.c"
    ;
    iVar2 = -1;
    if ((greatest_info.flags & 4) != 0) {
LAB_0011c045:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-feed.c"
      ;
      abort();
    }
  }
LAB_0011bf27:
  greatest_test_post(iVar2);
  return;
}

Assistant:

SUITE(CGTFS_Feed) {
    RUN_TEST(feed_parsing);
    RUN_TEST(feed_comparison);
}